

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O0

void __thiscall UUID_Create_Test::TestBody(UUID_Create_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_c8;
  Message local_c0;
  variant_type local_b8 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98;
  version_type local_90 [2];
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  uuid t;
  UUID_Create_Test *this_local;
  
  pstore::uuid::uuid((uuid *)&gtest_ar_.message_);
  local_31 = pstore::uuid::is_null((uuid *)&gtest_ar_.message_);
  local_31 = !local_31;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_30,(AssertionResult *)"t.is_null ()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_90[1] = 4;
  local_90[0] = pstore::uuid::version((uuid *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<pstore::uuid::version_type,_pstore::uuid::version_type,_nullptr>
            ((EqHelper *)local_88,"pstore::uuid::version_type::random_number_based","t.version ()",
             local_90 + 1,local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_b8[1] = 1;
  local_b8[0] = pstore::uuid::variant((uuid *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<pstore::uuid::variant_type,_pstore::uuid::variant_type,_nullptr>
            ((EqHelper *)local_b0,"pstore::uuid::variant_type::rfc_4122","t.variant ()",local_b8 + 1
             ,local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return;
}

Assistant:

TEST (UUID, Create) {
    pstore::uuid const t;
    EXPECT_FALSE (t.is_null ());
    EXPECT_EQ (pstore::uuid::version_type::random_number_based, t.version ());
    EXPECT_EQ (pstore::uuid::variant_type::rfc_4122, t.variant ());
}